

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aq_cyclicrefresh.c
# Opt level: O3

CYCLIC_REFRESH * av1_cyclic_refresh_alloc(int mi_rows,int mi_cols)

{
  CYCLIC_REFRESH *memblk;
  int8_t *piVar1;
  
  memblk = (CYCLIC_REFRESH *)aom_calloc(1,0x78);
  if (memblk != (CYCLIC_REFRESH *)0x0) {
    piVar1 = (int8_t *)aom_calloc((long)(mi_cols * mi_rows),1);
    memblk->map = piVar1;
    memblk->counter_encode_maxq_scene_change = 0;
    memblk->percent_refresh_adjustment = 5;
    memblk->rate_ratio_qdelta_adjustment = 0.25;
    if (piVar1 != (int8_t *)0x0) {
      return memblk;
    }
    aom_free((void *)0x0);
    aom_free(memblk);
  }
  return (CYCLIC_REFRESH *)0x0;
}

Assistant:

CYCLIC_REFRESH *av1_cyclic_refresh_alloc(int mi_rows, int mi_cols) {
  CYCLIC_REFRESH *const cr = aom_calloc(1, sizeof(*cr));
  if (cr == NULL) return NULL;

  cr->map = aom_calloc(mi_rows * mi_cols, sizeof(*cr->map));
  cr->counter_encode_maxq_scene_change = 0;
  cr->percent_refresh_adjustment = 5;
  cr->rate_ratio_qdelta_adjustment = 0.25;
  if (cr->map == NULL) {
    av1_cyclic_refresh_free(cr);
    return NULL;
  }
  return cr;
}